

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O1

size_t readto(io_buf *i,char **pointer,char terminal)

{
  char cVar1;
  int *piVar2;
  char *pcVar3;
  ssize_t sVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  size_t __n;
  
  do {
    pcVar3 = i->head;
    *pointer = pcVar3;
    pcVar8 = (i->space)._end;
    if (pcVar3 < pcVar8) {
      cVar1 = *pcVar3;
      while (cVar1 != terminal) {
        pcVar3 = pcVar3 + 1;
        *pointer = pcVar3;
        pcVar8 = (i->space)._end;
        if (pcVar8 <= pcVar3) break;
        cVar1 = *pcVar3;
      }
    }
    if (pcVar3 != pcVar8) {
      lVar6 = (long)pcVar3 - (long)i->head;
      i->head = pcVar3 + 1;
      *pointer = *pointer + -lVar6;
      return lVar6 + 1;
    }
    if (pcVar8 == (i->space).end_array) {
      __n = (long)pcVar8 - (long)i->head;
      memmove((i->space)._begin,i->head,__n);
      pcVar3 = (i->space)._begin;
      i->head = pcVar3;
      pcVar3 = pcVar3 + __n;
      (i->space)._end = pcVar3;
      *pointer = pcVar3;
    }
    piVar2 = (i->files)._begin;
    if ((((ulong)((long)(i->files)._end - (long)piVar2 >> 2) <= i->current) ||
        (sVar4 = io_buf::fill(i,piVar2[i->current]), sVar4 < 1)) &&
       (piVar2 = (i->files)._end, uVar7 = i->current + 1, i->current = uVar7,
       (ulong)((long)piVar2 - (long)(i->files)._begin >> 2) <= uVar7)) {
      sVar5 = (long)*pointer - (long)i->head;
      i->head = *pointer;
      *pointer = *pointer + -sVar5;
      return sVar5;
    }
  } while( true );
}

Assistant:

size_t readto(io_buf& i, char*& pointer, char terminal)
{
  // Return a pointer to the bytes before the terminal.  Must be less than the buffer size.
  pointer = i.head;
  while (pointer < i.space.end() && *pointer != terminal) pointer++;
  if (pointer != i.space.end())
  {
    size_t n = pointer - i.head;
    i.head = pointer + 1;
    pointer -= n;
    return n + 1;
  }
  else
  {
    if (i.space.end() == i.space.end_array)
    {
      size_t left = i.space.end() - i.head;
      memmove(i.space.begin(), i.head, left);
      i.head = i.space.begin();
      i.space.end() = i.space.begin() + left;
      pointer = i.space.end();
    }
    if (i.current < i.files.size() && i.fill(i.files[i.current]) > 0)  // more bytes are read.
      return readto(i, pointer, terminal);
    else if (++i.current < i.files.size())  // no more bytes, so go to next file.
      return readto(i, pointer, terminal);
    else  // no more bytes to read, return everything we have.
    {
      size_t n = pointer - i.head;
      i.head = pointer;
      pointer -= n;
      return n;
    }
  }
}